

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::
update_simplex_tree_after_node_insertion
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,Simplex_handle *sh)

{
  Simplex_handle *sh_local;
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this_local;
  
  return;
}

Assistant:

void update_simplex_tree_after_node_insertion(Simplex_handle sh) {
#ifdef DEBUG_TRACES
    std::clog << "update_simplex_tree_after_node_insertion" << std::endl;
#endif  // DEBUG_TRACES
    if constexpr (Options::link_nodes_by_label) {
      // Creates an entry with sh->first if not already in the map and insert sh->second at the end of the list
      nodes_label_to_list_[sh->first].push_back(_to_node_it(sh)->second);
    }
  }